

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall leveldb::RecoveryTest::RemoveManifestFile(RecoveryTest *this)

{
  Env *pEVar1;
  bool bVar2;
  char *message;
  AssertHelper local_60;
  Message local_58;
  string local_50;
  Status local_30;
  char local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  RecoveryTest *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  pEVar1 = this->env_;
  ManifestFileName_abi_cxx11_(&local_50,this);
  (*pEVar1->_vptr_Env[8])(&local_30,pEVar1,&local_50);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_20,&local_21,
             (Status *)"env_->RemoveFile(ManifestFileName())");
  Status::~Status(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(&local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

void RemoveManifestFile() {
    ASSERT_LEVELDB_OK(env_->RemoveFile(ManifestFileName()));
  }